

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncCastEmulation.cpp
# Opt level: O2

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::ParallelFuncCastEmulation::create(ParallelFuncCastEmulation *this)

{
  long in_RSI;
  HeapType local_20;
  
  std::make_unique<wasm::ParallelFuncCastEmulation,wasm::HeapType&,unsigned_int&>
            (&local_20,(uint *)(in_RSI + 0x130));
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)local_20.id;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<ParallelFuncCastEmulation>(ABIType, numParams);
  }